

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v9::detail::bigint::assign(bigint *this,bigint *other)

{
  size_t count;
  
  count = (other->bigits_).super_buffer<unsigned_int>.size_;
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,count);
  if (count != 0) {
    memmove((this->bigits_).super_buffer<unsigned_int>.ptr_,
            (other->bigits_).super_buffer<unsigned_int>.ptr_,count << 2);
  }
  this->exp_ = other->exp_;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    std::copy(data, data + size, make_checked(bigits_.data(), size));
    exp_ = other.exp_;
  }